

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

string * __thiscall
helics::apps::TemplateMatcher::instantiateTemplate_abi_cxx11_(TemplateMatcher *this,size_t index)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  reference pvVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_RSI;
  string *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_t subIndex;
  size_t ii;
  string *rval;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined8 local_28;
  undefined8 local_18;
  
  pbVar5 = in_RDX;
  pvVar3 = CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_ffffffffffffff80);
  if (pbVar5 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pvVar3) {
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::front(in_stack_ffffffffffffff80);
    std::__cxx11::string::string(in_stack_ffffffffffffffc0,pbVar5);
    local_18 = in_RDX;
    for (local_28 = 0;
        sVar4 = CLI::std::
                vector<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::size((vector<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)(in_RSI + 0x78)), local_28 < sVar4; local_28 = local_28 + 1) {
      this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0x90);
      pbVar5 = local_18;
      CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_00,local_28);
      __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pvVar3 = CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (this_00,local_28);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *pvVar3;
      auVar2._8_8_ = __str;
      auVar2._0_8_ = local_18;
      CLI::std::
      vector<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[]((vector<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)(in_RSI + 0x78),local_28);
      CLI::std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)pbVar5,(size_type)this_00);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (local_18,__str);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RSI + 0x60),local_28 + 1);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (local_18,__str);
      local_18 = SUB168(auVar2 % auVar1,0);
    }
  }
  else {
    std::__cxx11::string::string(in_stack_ffffffffffffff90);
  }
  return in_RDI;
}

Assistant:

std::string TemplateMatcher::instantiateTemplate(std::size_t index)
{
    if (index >= combinations.back()) {
        return {};
    }
    std::string rval = intermediaries.front();
    for (std::size_t ii = 0; ii < keys.size(); ++ii) {
        const std::size_t subIndex = index / combinations[ii];
        index = index % combinations[ii];
        rval.append(keys[ii][subIndex]);
        rval.append(intermediaries[ii + 1]);
    }
    return rval;
}